

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

BIT_DStream_status duckdb_zstd::BIT_reloadDStream_internal(BIT_DStream_t *bitD)

{
  size_t sVar1;
  size_t *in_RDI;
  
  in_RDI[2] = in_RDI[2] - (ulong)((uint)in_RDI[1] >> 3);
  *(uint *)(in_RDI + 1) = (uint)in_RDI[1] & 7;
  sVar1 = MEM_readLEST(in_RDI);
  *in_RDI = sVar1;
  return BIT_DStream_unfinished;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream_internal(BIT_DStream_t* bitD)
{
    assert(bitD->bitsConsumed <= sizeof(bitD->bitContainer)*8);
    bitD->ptr -= bitD->bitsConsumed >> 3;
    assert(bitD->ptr >= bitD->start);
    bitD->bitsConsumed &= 7;
    bitD->bitContainer = MEM_readLEST(bitD->ptr);
    return BIT_DStream_unfinished;
}